

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O3

void llb_build_key_get_custom_task_name(llb_build_key_t *key,llb_data_t *out_name)

{
  char *pcVar1;
  uint8_t *puVar2;
  StringRef SVar3;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  SVar3 = llbuild::buildsystem::BuildKey::getCustomTaskName((BuildKey *)(key + 0x10));
  pcVar1 = SVar3.Data;
  out_name->length = SVar3.Length;
  local_38 = &local_28;
  if (pcVar1 == (char *)0x0) {
    local_30 = 0;
    local_28 = '\0';
    puVar2 = (uint8_t *)strdup(&local_28);
    out_name->data = puVar2;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,pcVar1,pcVar1 + SVar3.Length);
    pcVar1 = local_38;
    puVar2 = (uint8_t *)strdup(local_38);
    out_name->data = puVar2;
    if (pcVar1 != &local_28) {
      operator_delete(pcVar1,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  return;
}

Assistant:

void llb_build_key_get_custom_task_name(llb_build_key_t *key, llb_data_t *out_name) {
  auto name = ((CAPIBuildKey *)key)->getInternalBuildKey().getCustomTaskName();
  out_name->length = name.size();
  out_name->data = (const uint8_t*)strdup(name.str().c_str());
}